

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

ValueInfo * __thiscall
GlobOptBlockData::MergeArrayValueInfo
          (GlobOptBlockData *this,ValueType mergedValueType,ArrayValueInfo *toDataValueInfo,
          ArrayValueInfo *fromDataValueInfo,Sym *arraySym,
          BVSparse<Memory::JitArenaAllocator> *symsRequiringCompensation,
          BVSparse<Memory::JitArenaAllocator> *symsCreatedForMerge,bool isLoopBackEdge)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  undefined4 *puVar4;
  StackSym *pSVar5;
  StackSym *pSVar6;
  StackSym *local_60;
  StackSym *newLengthSym;
  StackSym *newHeadSegmentLengthSym;
  StackSym *newHeadSegmentSym;
  bool isLoopBackEdge_local;
  BVSparse<Memory::JitArenaAllocator> *symsRequiringCompensation_local;
  Sym *arraySym_local;
  ArrayValueInfo *fromDataValueInfo_local;
  ArrayValueInfo *toDataValueInfo_local;
  GlobOptBlockData *this_local;
  ArrayValueInfo *pAStack_10;
  ValueType mergedValueType_local;
  
  this_local._6_2_ = mergedValueType.field_0;
  bVar2 = ValueType::IsAnyOptimizedArray((ValueType *)((long)&this_local + 6));
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,1099,"(mergedValueType.IsAnyOptimizedArray())",
                       "mergedValueType.IsAnyOptimizedArray()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (toDataValueInfo == (ArrayValueInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x44c,"(toDataValueInfo)","toDataValueInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (fromDataValueInfo == (ArrayValueInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x44d,"(fromDataValueInfo)","fromDataValueInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (toDataValueInfo == fromDataValueInfo) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x44e,"(toDataValueInfo != fromDataValueInfo)",
                       "toDataValueInfo != fromDataValueInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (arraySym == (Sym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x44f,"(arraySym)","arraySym");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = GlobOpt::IsLoopPrePass(this->globOpt);
  if ((symsRequiringCompensation == (BVSparse<Memory::JitArenaAllocator> *)0x0) != bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x450,"(!symsRequiringCompensation == this->globOpt->IsLoopPrePass())",
                       "!symsRequiringCompensation == this->globOpt->IsLoopPrePass()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = GlobOpt::IsLoopPrePass(this->globOpt);
  if ((symsCreatedForMerge == (BVSparse<Memory::JitArenaAllocator> *)0x0) != bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x451,"(!symsCreatedForMerge == this->globOpt->IsLoopPrePass())",
                       "!symsCreatedForMerge == this->globOpt->IsLoopPrePass()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  newHeadSegmentLengthSym = (StackSym *)0x0;
  pSVar5 = ArrayValueInfo::HeadSegmentSym(toDataValueInfo);
  if ((pSVar5 != (StackSym *)0x0) &&
     (pSVar5 = ArrayValueInfo::HeadSegmentSym(fromDataValueInfo), pSVar5 != (StackSym *)0x0)) {
    pSVar5 = ArrayValueInfo::HeadSegmentSym(toDataValueInfo);
    pSVar6 = ArrayValueInfo::HeadSegmentSym(fromDataValueInfo);
    if (pSVar5 == pSVar6) {
      newHeadSegmentLengthSym = ArrayValueInfo::HeadSegmentSym(toDataValueInfo);
    }
    else {
      bVar2 = GlobOpt::IsLoopPrePass(this->globOpt);
      if ((!bVar2) && (!isLoopBackEdge)) {
        if (symsRequiringCompensation == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                             ,0x463,"(symsRequiringCompensation)","symsRequiringCompensation");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        BVSparse<Memory::JitArenaAllocator>::Set(symsRequiringCompensation,arraySym->m_id);
        if (symsCreatedForMerge == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                             ,0x465,"(symsCreatedForMerge)","symsCreatedForMerge");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        pSVar5 = ArrayValueInfo::HeadSegmentSym(toDataValueInfo);
        BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                          (symsCreatedForMerge,(pSVar5->super_Sym).m_id);
        if (BVar3 == '\0') {
          newHeadSegmentLengthSym = StackSym::New(TyUint64,this->globOpt->func);
          BVSparse<Memory::JitArenaAllocator>::Set
                    (symsCreatedForMerge,(newHeadSegmentLengthSym->super_Sym).m_id);
        }
        else {
          newHeadSegmentLengthSym = ArrayValueInfo::HeadSegmentSym(toDataValueInfo);
        }
      }
    }
  }
  newLengthSym = (StackSym *)0x0;
  pSVar5 = ArrayValueInfo::HeadSegmentLengthSym(toDataValueInfo);
  if ((pSVar5 != (StackSym *)0x0) &&
     (pSVar5 = ArrayValueInfo::HeadSegmentLengthSym(fromDataValueInfo), pSVar5 != (StackSym *)0x0))
  {
    pSVar5 = ArrayValueInfo::HeadSegmentLengthSym(toDataValueInfo);
    pSVar6 = ArrayValueInfo::HeadSegmentLengthSym(fromDataValueInfo);
    if (pSVar5 == pSVar6) {
      newLengthSym = ArrayValueInfo::HeadSegmentLengthSym(toDataValueInfo);
    }
    else {
      bVar2 = GlobOpt::IsLoopPrePass(this->globOpt);
      if ((!bVar2) && (!isLoopBackEdge)) {
        if (symsRequiringCompensation == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                             ,0x47e,"(symsRequiringCompensation)","symsRequiringCompensation");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        BVSparse<Memory::JitArenaAllocator>::Set(symsRequiringCompensation,arraySym->m_id);
        if (symsCreatedForMerge == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                             ,0x480,"(symsCreatedForMerge)","symsCreatedForMerge");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        pSVar5 = ArrayValueInfo::HeadSegmentLengthSym(toDataValueInfo);
        BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                          (symsCreatedForMerge,(pSVar5->super_Sym).m_id);
        if (BVar3 == '\0') {
          newLengthSym = StackSym::New(TyUint32,this->globOpt->func);
          BVSparse<Memory::JitArenaAllocator>::Set
                    (symsCreatedForMerge,(newLengthSym->super_Sym).m_id);
        }
        else {
          newLengthSym = ArrayValueInfo::HeadSegmentLengthSym(toDataValueInfo);
        }
      }
    }
  }
  local_60 = (StackSym *)0x0;
  pSVar5 = ArrayValueInfo::LengthSym(toDataValueInfo);
  if ((pSVar5 != (StackSym *)0x0) &&
     (pSVar5 = ArrayValueInfo::LengthSym(fromDataValueInfo), pSVar5 != (StackSym *)0x0)) {
    pSVar5 = ArrayValueInfo::LengthSym(toDataValueInfo);
    pSVar6 = ArrayValueInfo::LengthSym(fromDataValueInfo);
    if (pSVar5 == pSVar6) {
      local_60 = ArrayValueInfo::LengthSym(toDataValueInfo);
    }
    else {
      bVar2 = GlobOpt::IsLoopPrePass(this->globOpt);
      if ((!bVar2) && (!isLoopBackEdge)) {
        if (symsRequiringCompensation == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                             ,0x499,"(symsRequiringCompensation)","symsRequiringCompensation");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        BVSparse<Memory::JitArenaAllocator>::Set(symsRequiringCompensation,arraySym->m_id);
        if (symsCreatedForMerge == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                             ,0x49b,"(symsCreatedForMerge)","symsCreatedForMerge");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        pSVar5 = ArrayValueInfo::LengthSym(toDataValueInfo);
        BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                          (symsCreatedForMerge,(pSVar5->super_Sym).m_id);
        if (BVar3 == '\0') {
          local_60 = StackSym::New(TyUint32,this->globOpt->func);
          BVSparse<Memory::JitArenaAllocator>::Set(symsCreatedForMerge,(local_60->super_Sym).m_id);
        }
        else {
          local_60 = ArrayValueInfo::LengthSym(toDataValueInfo);
        }
      }
    }
  }
  if (((newHeadSegmentLengthSym == (StackSym *)0x0) && (newLengthSym == (StackSym *)0x0)) &&
     (local_60 == (StackSym *)0x0)) {
    if (symsRequiringCompensation != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      BVSparse<Memory::JitArenaAllocator>::Clear(symsRequiringCompensation,arraySym->m_id);
    }
    pAStack_10 = (ArrayValueInfo *)ValueInfo::New(this->globOpt->alloc,(ValueType)this_local._6_2_);
  }
  else {
    pAStack_10 = ArrayValueInfo::New(this->globOpt->alloc,(ValueType)this_local._6_2_,
                                     newHeadSegmentLengthSym,newLengthSym,local_60,(Sym *)0x0);
  }
  return &pAStack_10->super_ValueInfo;
}

Assistant:

ValueInfo *GlobOptBlockData::MergeArrayValueInfo(
    const ValueType mergedValueType,
    const ArrayValueInfo *const toDataValueInfo,
    const ArrayValueInfo *const fromDataValueInfo,
    Sym *const arraySym,
    BVSparse<JitArenaAllocator> *const symsRequiringCompensation,
    BVSparse<JitArenaAllocator> *const symsCreatedForMerge,
    bool isLoopBackEdge)
{
    Assert(mergedValueType.IsAnyOptimizedArray());
    Assert(toDataValueInfo);
    Assert(fromDataValueInfo);
    Assert(toDataValueInfo != fromDataValueInfo);
    Assert(arraySym);
    Assert(!symsRequiringCompensation == this->globOpt->IsLoopPrePass());
    Assert(!symsCreatedForMerge == this->globOpt->IsLoopPrePass());

    // Merge the segment and segment length syms. If we have the segment and/or the segment length syms available on both sides
    // but in different syms, create a new sym and record that the array sym requires compensation. Compensation will be
    // inserted later to initialize this new sym from all predecessors of the merged block.

    StackSym *newHeadSegmentSym = nullptr;
    if(toDataValueInfo->HeadSegmentSym() && fromDataValueInfo->HeadSegmentSym())
    {
        if(toDataValueInfo->HeadSegmentSym() == fromDataValueInfo->HeadSegmentSym())
        {
            newHeadSegmentSym = toDataValueInfo->HeadSegmentSym();
        }
        else
        {
            if (!this->globOpt->IsLoopPrePass() && !isLoopBackEdge)
            {
                // Adding compensation code in the prepass won't help, as the symstores would again be different in the main pass.
                Assert(symsRequiringCompensation);
                symsRequiringCompensation->Set(arraySym->m_id);
                Assert(symsCreatedForMerge);
                if (symsCreatedForMerge->Test(toDataValueInfo->HeadSegmentSym()->m_id))
                {
                    newHeadSegmentSym = toDataValueInfo->HeadSegmentSym();
                }
                else
                {
                    newHeadSegmentSym = StackSym::New(TyMachPtr, this->globOpt->func);
                    symsCreatedForMerge->Set(newHeadSegmentSym->m_id);
                }
            }
        }
    }

    StackSym *newHeadSegmentLengthSym = nullptr;
    if(toDataValueInfo->HeadSegmentLengthSym() && fromDataValueInfo->HeadSegmentLengthSym())
    {
        if(toDataValueInfo->HeadSegmentLengthSym() == fromDataValueInfo->HeadSegmentLengthSym())
        {
            newHeadSegmentLengthSym = toDataValueInfo->HeadSegmentLengthSym();
        }
        else
        {
            if (!this->globOpt->IsLoopPrePass() && !isLoopBackEdge)
            {
                Assert(symsRequiringCompensation);
                symsRequiringCompensation->Set(arraySym->m_id);
                Assert(symsCreatedForMerge);
                if (symsCreatedForMerge->Test(toDataValueInfo->HeadSegmentLengthSym()->m_id))
                {
                    newHeadSegmentLengthSym = toDataValueInfo->HeadSegmentLengthSym();
                }
                else
                {
                    newHeadSegmentLengthSym = StackSym::New(TyUint32, this->globOpt->func);
                    symsCreatedForMerge->Set(newHeadSegmentLengthSym->m_id);
                }
            }
        }
    }

    StackSym *newLengthSym = nullptr;
    if(toDataValueInfo->LengthSym() && fromDataValueInfo->LengthSym())
    {
        if(toDataValueInfo->LengthSym() == fromDataValueInfo->LengthSym())
        {
            newLengthSym = toDataValueInfo->LengthSym();
        }
        else
        {
            if (!this->globOpt->IsLoopPrePass() && !isLoopBackEdge)
            {
                Assert(symsRequiringCompensation);
                symsRequiringCompensation->Set(arraySym->m_id);
                Assert(symsCreatedForMerge);
                if (symsCreatedForMerge->Test(toDataValueInfo->LengthSym()->m_id))
                {
                    newLengthSym = toDataValueInfo->LengthSym();
                }
                else
                {
                    newLengthSym = StackSym::New(TyUint32, this->globOpt->func);
                    symsCreatedForMerge->Set(newLengthSym->m_id);
                }
            }
        }
    }

    if(newHeadSegmentSym || newHeadSegmentLengthSym || newLengthSym)
    {
        return ArrayValueInfo::New(this->globOpt->alloc, mergedValueType, newHeadSegmentSym, newHeadSegmentLengthSym, newLengthSym);
    }

    if(symsRequiringCompensation)
    {
        symsRequiringCompensation->Clear(arraySym->m_id);
    }
    return ValueInfo::New(this->globOpt->alloc, mergedValueType);
}